

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O1

void __thiscall TPZStructMatrix::Read(TPZStructMatrix *this,TPZStream *buf,void *context)

{
  TPZSavable *pTVar1;
  TPZCompMesh *pTVar2;
  TPZAutoPointer<TPZCompMesh> local_30;
  TPZAutoPointer<TPZSavable> local_28;
  
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar2 = (TPZCompMesh *)0x0;
  }
  else {
    pTVar2 = (TPZCompMesh *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZCompMesh::typeinfo,0xffffffffffffffff);
  }
  this->fMesh = pTVar2;
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_28,buf);
  TPZAutoPointerDynamicCast<TPZCompMesh,TPZSavable>((TPZAutoPointer<TPZSavable> *)&local_30);
  TPZAutoPointer<TPZCompMesh>::operator=(&this->fCompMesh,&local_30);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_30);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_28);
  TPZStream::Read<int>(buf,&this->fMaterialIds);
  TPZEquationFilter::Read(&this->fEquationFilter,buf,context);
  return;
}

Assistant:

void TPZStructMatrix::Read(TPZStream& buf, void* context) {
    //DO NOT READ FROM THE TPZMATPARINTERFACE
    fMesh = dynamic_cast<TPZCompMesh *>(TPZPersistenceManager::GetInstance(&buf));
    fCompMesh = TPZAutoPointerDynamicCast<TPZCompMesh>(TPZPersistenceManager::GetAutoPointer(&buf));
    buf.Read(fMaterialIds);
    fEquationFilter.Read(buf,context);
}